

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.cpp
# Opt level: O0

void __thiscall Base64Encode_RFC4648SixChars_Test::TestBody(Base64Encode_RFC4648SixChars_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_88;
  Message local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string actual;
  Base64Encode_RFC4648SixChars_Test *this_local;
  
  actual.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"foobar",&local_51);
  anon_unknown.dwarf_eada::Base64Encode::convert
            ((string *)local_30,&this->super_Base64Encode,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  testing::internal::EqHelper::
  Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_78,"\"Zm9vYmFy\"","actual",(char (*) [9])"Zm9vYmFy",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_base64.cpp"
               ,0x55,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F (Base64Encode, RFC4648SixChars) {
    std::string const actual = convert ("foobar");
    EXPECT_EQ ("Zm9vYmFy", actual);
}